

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBABecLap.cpp
# Opt level: O0

void __thiscall amrex::MLEBABecLap::averageDownCoeffs(MLEBABecLap *this)

{
  Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *period;
  FabArray<amrex::FArrayBox> *this_00;
  int *piVar1;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_RDI;
  int idim;
  int mglev;
  int amrlev_1;
  Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
  *fine_b_coeffs;
  Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *fine_a_coeffs;
  int amrlev;
  reference in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  int iVar2;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  *in_stack_ffffffffffffff68;
  Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
  *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int iVar4;
  int local_68;
  int in_stack_ffffffffffffff9c;
  int iVar5;
  MLEBABecLap *in_stack_ffffffffffffffa0;
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  local_38;
  Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
  *local_20;
  Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *local_18;
  int local_c;
  
  local_c = *(int *)((long)&in_RDI[2].
                            super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                            super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                            ._M_impl.super__Vector_impl_data._M_start + 4);
  while (iVar5 = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20), local_c = local_c + -1,
        0 < local_c) {
    local_18 = Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
               ::operator[]((Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                            (size_type)in_stack_ffffffffffffff18);
    local_20 = Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
               ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                            (size_type)in_stack_ffffffffffffff18);
    in_stack_ffffffffffffff54 = local_c;
    Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
    ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 (size_type)in_stack_ffffffffffffff18);
    in_stack_ffffffffffffff68 = &local_38;
    GetVecOfPtrs<amrex::MultiFab>(in_stack_ffffffffffffff68);
    averageDownCoeffsSameAmrLevel
              ((MLEBABecLap *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
               (Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78,in_RDI);
    Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x1781934);
    averageDownCoeffsToCoarseAmrLevel(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  }
  uVar3 = 0;
  period = Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
           ::operator[]((Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                         *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                        (size_type)in_stack_ffffffffffffff18);
  this_00 = (FabArray<amrex::FArrayBox> *)
            Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
            ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                          *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                         (size_type)in_stack_ffffffffffffff18);
  Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (size_type)in_stack_ffffffffffffff18);
  GetVecOfPtrs<amrex::MultiFab>(in_stack_ffffffffffffff68);
  averageDownCoeffsSameAmrLevel
            ((MLEBABecLap *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),iVar5,
             (Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),in_stack_ffffffffffffff78
             ,in_RDI);
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x1781a16);
  for (iVar5 = 0;
      iVar5 < *(int *)((long)&in_RDI[2].
                              super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                              super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                              ._M_impl.super__Vector_impl_data._M_start + 4); iVar5 = iVar5 + 1) {
    local_68 = 0;
    while( true ) {
      iVar2 = local_68;
      piVar1 = Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)
                          CONCAT44(local_68,in_stack_ffffffffffffff20),
                          (size_type)in_stack_ffffffffffffff18);
      if (*piVar1 <= iVar2) break;
      for (iVar4 = 0; iVar4 < 3; iVar4 = iVar4 + 1) {
        Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
        ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                      *)CONCAT44(iVar2,in_stack_ffffffffffffff20),
                     (size_type)in_stack_ffffffffffffff18);
        Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
        ::operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                      *)CONCAT44(iVar2,in_stack_ffffffffffffff20),
                     (size_type)in_stack_ffffffffffffff18);
        in_stack_ffffffffffffff18 =
             std::array<amrex::MultiFab,_3UL>::operator[]
                       ((array<amrex::MultiFab,_3UL> *)CONCAT44(iVar2,in_stack_ffffffffffffff20),
                        (size_type)in_stack_ffffffffffffff18);
        Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
        ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                      *)CONCAT44(iVar2,in_stack_ffffffffffffff20),
                     (size_type)in_stack_ffffffffffffff18);
        Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                  ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                   CONCAT44(iVar2,in_stack_ffffffffffffff20),(size_type)in_stack_ffffffffffffff18);
        Geometry::periodicity
                  ((Geometry *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
        FabArray<amrex::FArrayBox>::FillBoundary<double>
                  (this_00,(Periodicity *)period,SUB41((uint)uVar3 >> 0x18,0));
      }
      local_68 = local_68 + 1;
    }
  }
  return;
}

Assistant:

void
MLEBABecLap::averageDownCoeffs ()
{
    for (int amrlev = m_num_amr_levels-1; amrlev > 0; --amrlev)
    {
        auto& fine_a_coeffs = m_a_coeffs[amrlev];
        auto& fine_b_coeffs = m_b_coeffs[amrlev];

        averageDownCoeffsSameAmrLevel(amrlev, fine_a_coeffs, fine_b_coeffs,
                                      amrex::GetVecOfPtrs(m_eb_b_coeffs[0]));
        averageDownCoeffsToCoarseAmrLevel(amrlev);
    }

    averageDownCoeffsSameAmrLevel(0, m_a_coeffs[0], m_b_coeffs[0],
                                  amrex::GetVecOfPtrs(m_eb_b_coeffs[0]));

    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev) {
        for (int mglev = 0; mglev < m_num_mg_levels[amrlev]; ++mglev) {
            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                m_b_coeffs[amrlev][mglev][idim].FillBoundary(m_geom[amrlev][mglev].periodicity());
            }
        }
    }
}